

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

bool __thiscall xla::GraphCycles::InsertEdge(GraphCycles *this,int32_t x,int32_t y)

{
  int iVar1;
  Rep *r;
  pointer pNVar2;
  pointer piVar3;
  pointer pNVar4;
  int *piVar5;
  pointer piVar6;
  bool bVar7;
  bool bVar8;
  long lVar9;
  int *piVar10;
  OrderedNodeSet *this_00;
  int local_4c;
  OrderedSet<int> *local_48;
  int local_3c;
  pointer local_38;
  
  if (x == y) {
    bVar8 = false;
  }
  else {
    r = this->rep_;
    this_00 = &(r->node_io_).
               super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
               ._M_impl.super__Vector_impl_data._M_start[x].out;
    bVar7 = OrderedSet<int>::Insert(this_00,y);
    bVar8 = true;
    if (bVar7) {
      local_38 = (r->node_io_).
                 super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                 ._M_impl.super__Vector_impl_data._M_start + y;
      local_48 = this_00;
      OrderedSet<int>::Insert(&local_38->in,x);
      pNVar2 = (r->nodes_).
               super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pNVar2[y].rank < pNVar2[x].rank) {
        bVar8 = ForwardDFS(r,y,pNVar2[x].rank);
        if (!bVar8) {
          OrderedSet<int>::Erase(local_48,y);
          OrderedSet<int>::Erase(&local_38->in,x);
          ClearVisitedBits(r,&r->deltaf_);
          return false;
        }
        iVar1 = pNVar2[y].rank;
        piVar3 = (r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar3) {
          (r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_finish = piVar3;
        }
        piVar3 = (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar3) {
          (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = piVar3;
        }
        local_48 = (OrderedSet<int> *)&r->deltab_;
        local_4c = x;
        std::vector<int,_std::allocator<int>_>::push_back(&r->stack_,&local_4c);
        while (piVar3 = (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish,
              (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != piVar3) {
          local_4c = piVar3[-1];
          (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = piVar3 + -1;
          pNVar2 = (r->nodes_).
                   super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (pNVar2[local_4c].visited == false) {
            pNVar2[local_4c].visited = true;
            std::vector<int,_std::allocator<int>_>::push_back(&local_48->value_sequence_,&local_4c);
            pNVar4 = (r->node_io_).
                     super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            piVar5 = *(pointer *)
                      ((long)&pNVar4[local_4c].in.value_sequence_.
                              super__Vector_base<int,_std::allocator<int>_> + 8);
            for (piVar10 = *(int **)&pNVar4[local_4c].in.value_sequence_.
                                     super__Vector_base<int,_std::allocator<int>_>;
                piVar10 != piVar5; piVar10 = piVar10 + 1) {
              local_3c = *piVar10;
              pNVar2 = (r->nodes_).
                       super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if ((pNVar2[local_3c].visited == false) && (iVar1 < pNVar2[local_3c].rank)) {
                std::vector<int,_std::allocator<int>_>::push_back(&r->stack_,&local_3c);
              }
            }
          }
        }
        Sort(&r->nodes_,&local_48->value_sequence_);
        Sort(&r->nodes_,&r->deltaf_);
        piVar3 = (r->list_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((r->list_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish != piVar3) {
          (r->list_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = piVar3;
        }
        MoveToList(r,&local_48->value_sequence_,&r->list_);
        MoveToList(r,&r->deltaf_,&r->list_);
        std::vector<int,_std::allocator<int>_>::resize
                  (&r->merged_,
                   ((long)(r->deltaf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(r->deltaf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) +
                   ((long)(r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2));
        std::
        __merge<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  ((r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (r->deltaf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (r->deltaf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (r->merged_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start);
        piVar3 = (r->list_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = (r->list_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (lVar9 = 0; (long)piVar6 - (long)piVar3 >> 2 != lVar9; lVar9 = lVar9 + 1) {
          (r->nodes_).
          super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
          ._M_impl.super__Vector_impl_data._M_start[piVar3[lVar9]].rank =
               (r->merged_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar9];
        }
      }
      bVar8 = true;
    }
  }
  return bVar8;
}

Assistant:

bool GraphCycles::InsertEdge(int32_t x, int32_t y) {
  if (x == y) return false;
  Rep* r = rep_;
  NodeIO* nx_io = &r->node_io_[x];
  if (!nx_io->out.Insert(y)) {
    // Edge already exists.
    return true;
  }

  NodeIO* ny_io = &r->node_io_[y];
  ny_io->in.Insert(x);

  Node* nx = &r->nodes_[x];
  Node* ny = &r->nodes_[y];
  if (nx->rank <= ny->rank) {
    // New edge is consistent with existing rank assignment.
    return true;
  }

  // Current rank assignments are incompatible with the new edge.  Recompute.
  // We only need to consider nodes that fall in the range [ny->rank,nx->rank].
  if (!ForwardDFS(r, y, nx->rank)) {
    // Found a cycle.  Undo the insertion and tell caller.
    nx_io->out.Erase(y);
    ny_io->in.Erase(x);
    // Since we do not call Reorder() on this path, clear any visited
    // markers left by ForwardDFS.
    ClearVisitedBits(r, r->deltaf_);
    return false;
  }
  BackwardDFS(r, x, ny->rank);
  Reorder(r);
  return true;
}